

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O0

void __thiscall fasttext::QuantMatrix::quantizeNorm(QuantMatrix *this,Vector *norms)

{
  long lVar1;
  int64_t iVar2;
  real *x;
  pointer codes;
  ProductQuantizer *in_RDI;
  real *dataptr;
  real *in_stack_00000100;
  int32_t in_stack_0000010c;
  ProductQuantizer *in_stack_00000110;
  int32_t in_stack_ffffffffffffffcc;
  
  if ((in_RDI[1].max_points_per_cluster_ & 1) == 0) {
    __assert_fail("qnorm_",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/quantmatrix.cc"
                  ,0x21,"void fasttext::QuantMatrix::quantizeNorm(const Vector &)");
  }
  iVar2 = Vector::size((Vector *)0x1e8359);
  lVar1._0_4_ = in_RDI->max_points_per_cluster_;
  lVar1._4_4_ = in_RDI->max_points_;
  if (iVar2 == lVar1) {
    x = Vector::data((Vector *)0x1e838f);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                *)0x1e83a2);
    ProductQuantizer::train(in_stack_00000110,in_stack_0000010c,in_stack_00000100);
    codes = std::
            unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
            ::operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                          *)0x1e83c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e83e5);
    ProductQuantizer::compute_codes(in_RDI,x,(uint8_t *)codes,in_stack_ffffffffffffffcc);
    return;
  }
  __assert_fail("norms.size() == m_",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/quantmatrix.cc"
                ,0x22,"void fasttext::QuantMatrix::quantizeNorm(const Vector &)");
}

Assistant:

void QuantMatrix::quantizeNorm(const Vector& norms) {
  assert(qnorm_);
  assert(norms.size() == m_);
  auto dataptr = norms.data();
  npq_->train(m_, dataptr);
  npq_->compute_codes(dataptr, norm_codes_.data(), m_);
}